

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff50;
  TPZGeoMesh *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  TPZGeoMesh **local_78;
  TPZGeoElSideIndex local_58;
  int local_40;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0;
  local_30 = 0x21;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0246b530);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff58);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0246b218;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0246b218;
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::TPZTriangleSphere
            ((TPZTriangleSphere<pzgeom::TPZGeoTriangle> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (TPZVec<long> *)in_stack_ffffffffffffff58);
  local_78 = &in_RDI[2].fMesh;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    local_78 = local_78 + 3;
  } while (local_78 != (TPZGeoMesh **)&in_RDI[4].fIndex);
  for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[2].fMesh + (long)local_40 * 3),&local_58);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x17d3698);
  }
  pzgeom::TPZNodeRep<3,_pztopology::TPZTriangle>::Initialize
            ((TPZNodeRep<3,_pztopology::TPZTriangle> *)(in_RDI + 1),in_RDI);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}